

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_log_post(ma_log *pLog,ma_uint32 level,char *pMessage)

{
  ma_result mVar1;
  ulong uVar2;
  void **ppvVar3;
  
  mVar1 = MA_INVALID_ARGS;
  if (pMessage != (char *)0x0 && pLog != (ma_log *)0x0) {
    if (pLog->callbackCount != 0) {
      ppvVar3 = &pLog->callbacks[0].pUserData;
      uVar2 = 0;
      do {
        if (((ma_log_callback *)(ppvVar3 + -1))->onLog != (ma_log_callback_proc)0x0) {
          (*((ma_log_callback *)(ppvVar3 + -1))->onLog)(*ppvVar3,level,pMessage);
        }
        uVar2 = uVar2 + 1;
        ppvVar3 = ppvVar3 + 2;
      } while (uVar2 < pLog->callbackCount);
    }
    mVar1 = MA_SUCCESS;
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_log_post(ma_log* pLog, ma_uint32 level, const char* pMessage)
{
    if (pLog == NULL || pMessage == NULL) {
        return MA_INVALID_ARGS;
    }

    ma_log_lock(pLog);
    {
        ma_uint32 iLog;
        for (iLog = 0; iLog < pLog->callbackCount; iLog += 1) {
            if (pLog->callbacks[iLog].onLog) {
                pLog->callbacks[iLog].onLog(pLog->callbacks[iLog].pUserData, level, pMessage);
            }
        }
    }
    ma_log_unlock(pLog);

    return MA_SUCCESS;
}